

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,string *config,bool forResponseFile)

{
  char cVar1;
  cmMakefile *pcVar2;
  OutputFormat format;
  string_view sVar3;
  bool bVar4;
  ulong uVar5;
  string *psVar6;
  ostream *poVar7;
  char *pcVar8;
  undefined1 *puVar9;
  byte extraout_DL;
  value_type *__x;
  bool local_542;
  string local_480 [8];
  string flags;
  string includePath;
  string local_430;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  *local_410;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  *local_400;
  undefined1 local_3f0 [8];
  string frameworkDir;
  string local_3c8;
  string *local_3a8;
  reference local_3a0;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  undefined1 local_348 [6];
  bool sysIncludeFlagUsed;
  bool flagUsed;
  cmValue local_328;
  cmValue sysFwSearchFlag;
  cmValue local_300;
  cmValue fwSearchFlag;
  string local_2d0;
  string *local_2b0;
  cmValue local_2a8;
  cmValue sysIncludeFlagWarning;
  cmValue sysIncludeFlag;
  cmValue local_278;
  cmValue incSep;
  string local_268 [6];
  bool repeatFlag;
  string sep;
  string local_240;
  cmValue local_220;
  byte local_211;
  undefined1 local_210 [7];
  bool quotePaths;
  string *local_1f0;
  string *includeFlag;
  ostringstream includeFlags;
  undefined1 local_68 [4];
  OutputFormat shellFormat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  allocator<char> local_3a;
  byte local_39;
  string *psStack_38;
  bool forResponseFile_local;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includeDirs_local;
  cmLocalGenerator *this_local;
  
  local_39 = forResponseFile;
  psStack_38 = config;
  config_local = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)includeDirs;
  includeDirs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)target_local);
    MoveSystemIncludesToEnd
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68,psStack_38,config_local,(cmGeneratorTarget *)lang_local);
    format = (local_39 & 1) * 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includeFlag);
    pcVar2 = this->Makefile;
    cmStrCat<char_const(&)[20],std::__cxx11::string_const&>
              ((string *)local_210,(char (*) [20])"CMAKE_INCLUDE_FLAG_",config_local);
    psVar6 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_210);
    std::__cxx11::string::~string((string *)local_210);
    local_211 = 0;
    pcVar2 = this->Makefile;
    local_1f0 = psVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"CMAKE_QUOTE_INCLUDE_PATHS",
               (allocator<char> *)(sep.field_2._M_local_buf + 0xf));
    local_220 = cmMakefile::GetDefinition(pcVar2,&local_240);
    bVar4 = cmValue::operator_cast_to_bool(&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)(sep.field_2._M_local_buf + 0xf));
    if (bVar4) {
      local_211 = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_268," ",(allocator<char> *)((long)&incSep.Value + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&incSep.Value + 7));
    incSep.Value._6_1_ = 1;
    pcVar2 = this->Makefile;
    cmStrCat<char_const(&)[24],std::__cxx11::string_const&>
              ((string *)&sysIncludeFlag,(char (*) [24])"CMAKE_INCLUDE_FLAG_SEP_",config_local);
    local_278 = cmMakefile::GetDefinition(pcVar2,(string *)&sysIncludeFlag);
    std::__cxx11::string::~string((string *)&sysIncludeFlag);
    bVar4 = cmValue::operator_cast_to_bool(&local_278);
    if (bVar4) {
      psVar6 = cmValue::operator*[abi_cxx11_(&local_278);
      std::__cxx11::string::operator=(local_268,(string *)psVar6);
      incSep.Value._6_1_ = 0;
    }
    cmValue::cmValue(&sysIncludeFlagWarning,(nullptr_t)0x0);
    cmValue::cmValue(&local_2a8,(nullptr_t)0x0);
    if ((incSep.Value._6_1_ & 1) != 0) {
      pcVar2 = this->Makefile;
      cmStrCat<char_const(&)[27],std::__cxx11::string_const&>
                (&local_2d0,(char (*) [27])0xfe83ab,config_local);
      local_2b0 = (string *)cmMakefile::GetDefinition(pcVar2,&local_2d0);
      sysIncludeFlagWarning.Value = local_2b0;
      std::__cxx11::string::~string((string *)&local_2d0);
      pcVar2 = this->Makefile;
      cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[9]>
                ((string *)&fwSearchFlag,(char (*) [28])"_CMAKE_INCLUDE_SYSTEM_FLAG_",config_local,
                 (char (*) [9])0x101c9c9);
      local_2a8 = cmMakefile::GetDefinition(pcVar2,(string *)&fwSearchFlag);
      std::__cxx11::string::~string((string *)&fwSearchFlag);
    }
    pcVar2 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[23]>
              ((string *)&sysFwSearchFlag,(char (*) [7])0xff3e8d,config_local,
               (char (*) [23])0xfe83cd);
    local_300 = cmMakefile::GetDefinition(pcVar2,(string *)&sysFwSearchFlag);
    std::__cxx11::string::~string((string *)&sysFwSearchFlag);
    pcVar2 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[30]>
              ((string *)local_348,(char (*) [7])0xff3e8d,config_local,
               (char (*) [30])"_SYSTEM_FRAMEWORK_SEARCH_FLAG");
    local_328 = cmMakefile::GetDefinition(pcVar2,(string *)local_348);
    std::__cxx11::string::~string((string *)local_348);
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar4) {
      local_3a0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      local_3a8 = local_300.Value;
      frameworkDir.field_2._M_local_buf[0xe] = '\0';
      frameworkDir.field_2._M_local_buf[0xd] = '\0';
      bVar4 = cmNonempty(local_300);
      local_542 = false;
      if (bVar4) {
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        frameworkDir.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"APPLE",
                   (allocator<char> *)(frameworkDir.field_2._M_local_buf + 0xf));
        frameworkDir.field_2._M_local_buf[0xd] = '\x01';
        bVar4 = cmMakefile::IsOn(pcVar2,&local_3c8);
        local_542 = false;
        if (bVar4) {
          local_542 = cmSystemTools::IsPathToFramework(local_3a0);
        }
      }
      if ((frameworkDir.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_3c8);
      }
      if ((frameworkDir.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)(frameworkDir.field_2._M_local_buf + 0xf));
      }
      if (local_542 == false) {
        if (((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) ||
           ((incSep.Value._6_1_ & 1) != 0)) {
          bVar4 = cmValue::operator_cast_to_bool(&sysIncludeFlagWarning);
          if ((bVar4) &&
             ((lang_local != (string *)0x0 &&
              (bVar4 = cmGeneratorTarget::IsSystemIncludeDirectory
                                 ((cmGeneratorTarget *)lang_local,local_3a0,psStack_38,config_local)
              , bVar4)))) {
            psVar6 = cmValue::operator*[abi_cxx11_(&sysIncludeFlagWarning);
            std::operator<<((ostream *)&includeFlag,(string *)psVar6);
            emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
          }
          else {
            std::operator<<((ostream *)&includeFlag,(string *)local_1f0);
          }
          emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        }
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[0x13])
                  ((undefined1 *)((long)&flags.field_2 + 8),this,local_3a0,(ulong)format);
        if ((((local_211 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
           (pcVar8 = (char *)std::__cxx11::string::front(), *pcVar8 != '\"')) {
          std::operator<<((ostream *)&includeFlag,"\"");
        }
        std::operator<<((ostream *)&includeFlag,(string *)(flags.field_2._M_local_buf + 8));
        if ((((local_211 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
           (pcVar8 = (char *)std::__cxx11::string::front(), *pcVar8 != '\"')) {
          std::operator<<((ostream *)&includeFlag,"\"");
        }
        std::operator<<((ostream *)&includeFlag,local_268);
        std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
      }
      else {
        cmsys::SystemTools::GetFilenamePath((string *)local_3f0,local_3a0);
        local_410 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                              *)&__range1,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_3f0,__x);
        local_400 = local_410;
        if ((extraout_DL & 1) != 0) {
          bVar4 = cmValue::operator_cast_to_bool(&local_328);
          if (((bVar4) && (lang_local != (string *)0x0)) &&
             (bVar4 = cmGeneratorTarget::IsSystemIncludeDirectory
                                ((cmGeneratorTarget *)lang_local,(string *)local_3f0,psStack_38,
                                 config_local), bVar4)) {
            psVar6 = cmValue::operator*[abi_cxx11_(&local_328);
            std::operator<<((ostream *)&includeFlag,(string *)psVar6);
          }
          else {
            psVar6 = cmValue::operator*[abi_cxx11_(&local_300);
            std::operator<<((ostream *)&includeFlag,(string *)psVar6);
          }
          sVar3 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_3f0);
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_430,&this->super_cmOutputConverter,sVar3,format,false);
          poVar7 = std::operator<<((ostream *)&includeFlag,(string *)&local_430);
          std::operator<<(poVar7," ");
          std::__cxx11::string::~string((string *)&local_430);
        }
        std::__cxx11::string::~string((string *)local_3f0);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    if (((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) &&
       (bVar4 = cmValue::operator_cast_to_bool(&local_2a8), bVar4)) {
      psVar6 = cmValue::operator*[abi_cxx11_(&local_2a8);
      std::operator<<((ostream *)&includeFlag,(string *)psVar6);
    }
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_268);
    if ((*pcVar8 != ' ') && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      pcVar8 = (char *)std::__cxx11::string::back();
      cVar1 = *pcVar8;
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_268);
      if (cVar1 == *pcVar8) {
        puVar9 = (undefined1 *)std::__cxx11::string::back();
        *puVar9 = 0x20;
      }
    }
    sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_480);
    cmTrimWhitespace_abi_cxx11_(__return_storage_ptr__,sVar3);
    std::__cxx11::string::~string(local_480);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includeFlag);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  std::vector<std::string> const& includeDirs, cmGeneratorTarget* target,
  std::string const& lang, std::string const& config, bool forResponseFile)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string const& includeFlag =
    this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  std::string sep = " ";
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (cmValue incSep = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_INCLUDE_FLAG_SEP_", lang))) {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    sep = *incSep;
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  cmValue sysIncludeFlag = nullptr;
  cmValue sysIncludeFlagWarning = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));
    sysIncludeFlagWarning = this->Makefile->GetDefinition(
      cmStrCat("_CMAKE_INCLUDE_SYSTEM_FLAG_", lang, "_WARNING"));
  }

  cmValue fwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_FRAMEWORK_SEARCH_FLAG"));
  cmValue sysFwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_SYSTEM_FRAMEWORK_SEARCH_FLAG"));

  bool flagUsed = false;
  bool sysIncludeFlagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (cmNonempty(fwSearchFlag) && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string const frameworkDir = cmSystemTools::GetFilenamePath(i);
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(frameworkDir, config, lang)) {
          includeFlags << *sysFwSearchFlag;
        } else {
          includeFlags << *fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << *sysIncludeFlag;
        sysIncludeFlagUsed = true;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath = this->ConvertToIncludeReference(i, shellFormat);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  if (sysIncludeFlagUsed && sysIncludeFlagWarning) {
    includeFlags << *sysIncludeFlagWarning;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return cmTrimWhitespace(flags);
}